

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O0

void __thiscall
bal::GraphMLWeightedStreamWriter::write_header(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  Cnf *value_local;
  GraphMLWeightedStreamWriter *this_local;
  
  GraphMLStreamWriter::write_header(&this->super_GraphMLStreamWriter,value);
  poVar1 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
  poVar1 = std::operator<<(poVar1,
                           "<key id=\"e_cardinality\" for=\"edge\" attr.name=\"cardinality\" attr.type=\"int\"/>"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream((StreamWriter<bal::Cnf> *)this);
  poVar1 = std::operator<<(poVar1,
                           "<key id=\"e_weight\" for=\"edge\" attr.name=\"weight\" attr.type=\"double\"/>"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void write_header(const Cnf& value) override {
            GraphMLStreamWriter::write_header(value);
            stream() << "<key id=\"e_cardinality\" for=\"edge\" attr.name=\"cardinality\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"e_weight\" for=\"edge\" attr.name=\"weight\" attr.type=\"double\"/>" << std::endl;
        }